

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O2

REF_STATUS ref_interp_tattle(REF_INTERP ref_interp,REF_INT node)

{
  double dVar1;
  int iVar2;
  REF_MPI pRVar3;
  REF_DBL *pRVar4;
  REF_DBL *pRVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  REF_DBL xyz [3];
  REF_INT nodes [27];
  double local_c8 [4];
  REF_INT local_a8 [30];
  
  if (node < ref_interp->max) {
    if (ref_interp->cell[node] == 0xffffffff) {
      uVar6 = 0;
      printf("empty cell %d\n",(ulong)(uint)node);
    }
    else {
      pRVar3 = ref_interp->ref_mpi;
      uVar6 = 0;
      printf("cell %d part %d node %d\n",(ulong)(uint)ref_interp->cell[node],
             (ulong)(uint)ref_interp->part[node],(ulong)(uint)node);
      pRVar4 = ref_interp->bary;
      printf("bary %f %f %f %f\n",pRVar4[node * 4],pRVar4[node * 4 + 1],pRVar4[node * 4 + 2],
             pRVar4[node * 4 + 3]);
      pRVar4 = ref_interp->to_grid->node->real;
      lVar8 = (long)(node * 0xf);
      printf("target %f %f %f\n",pRVar4[lVar8],pRVar4[lVar8 + 1],pRVar4[lVar8 + 2]);
      if (pRVar3->id == ref_interp->part[node]) {
        uVar6 = ref_cell_nodes(ref_interp->from_tet,ref_interp->cell[node],local_a8);
        if (uVar6 == 0) {
          for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
            local_c8[lVar8] = 0.0;
          }
          pRVar4 = ref_interp->bary;
          pRVar5 = ref_interp->from_grid->node->real;
          for (uVar7 = 0; uVar7 != 4; uVar7 = uVar7 + 1) {
            iVar2 = local_a8[uVar7];
            dVar1 = pRVar4[uVar7 | (long)(node * 4)];
            for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
              local_c8[lVar8] = pRVar5[iVar2 * 0xf + lVar8] * dVar1 + local_c8[lVar8];
            }
          }
          printf("interp %f %f %f error %e\n");
          uVar6 = 0;
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
                 0x26d,"ref_interp_tattle",(ulong)uVar6,"node needs to be localized");
        }
      }
    }
  }
  else {
    uVar6 = 0;
    printf("max %d too small for %d\n",(ulong)(uint)ref_interp->max,(ulong)(uint)node);
  }
  return uVar6;
}

Assistant:

REF_FCN REF_STATUS ref_interp_tattle(REF_INTERP ref_interp, REF_INT node) {
  REF_MPI ref_mpi = ref_interp_mpi(ref_interp);
  REF_INT i, j, nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL xyz[3], error;
  if (NULL == ref_interp) {
    printf("NULL interp %d\n", node);
    return REF_SUCCESS;
  }
  if (node >= ref_interp_max(ref_interp)) {
    printf("max %d too small for %d\n", ref_interp_max(ref_interp), node);
    return REF_SUCCESS;
  }
  if (REF_EMPTY == ref_interp->cell[node]) {
    printf("empty cell %d\n", node);
    return REF_SUCCESS;
  }
  printf("cell %d part %d node %d\n", ref_interp->cell[node],
         ref_interp->part[node], node);
  printf("bary %f %f %f %f\n", ref_interp->bary[0 + 4 * node],
         ref_interp->bary[1 + 4 * node], ref_interp->bary[2 + 4 * node],
         ref_interp->bary[3 + 4 * node]);
  printf("target %f %f %f\n",
         ref_node_xyz(ref_grid_node(ref_interp_to_grid(ref_interp)), 0, node),
         ref_node_xyz(ref_grid_node(ref_interp_to_grid(ref_interp)), 1, node),
         ref_node_xyz(ref_grid_node(ref_interp_to_grid(ref_interp)), 2, node));
  if (ref_mpi_rank(ref_mpi) == ref_interp->part[node]) {
    RSS(ref_cell_nodes(ref_interp_from_tet(ref_interp), ref_interp->cell[node],
                       nodes),
        "node needs to be localized");

    for (i = 0; i < 3; i++) xyz[i] = 0.0;
    for (j = 0; j < 4; j++) {
      for (i = 0; i < 3; i++) {
        xyz[i] += ref_interp->bary[j + 4 * node] *
                  ref_node_xyz(ref_grid_node(ref_interp_from_grid(ref_interp)),
                               i, nodes[j]);
      }
    }

    error =
        pow(xyz[0] - ref_node_xyz(ref_grid_node(ref_interp_to_grid(ref_interp)),
                                  0, node),
            2) +
        pow(xyz[1] - ref_node_xyz(ref_grid_node(ref_interp_to_grid(ref_interp)),
                                  1, node),
            2) +
        pow(xyz[2] - ref_node_xyz(ref_grid_node(ref_interp_to_grid(ref_interp)),
                                  2, node),
            2);
    error = sqrt(error);
    printf("interp %f %f %f error %e\n", xyz[0], xyz[1], xyz[2], error);
  }

  return REF_SUCCESS;
}